

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::SetupDataSource
          (ProducerEndpointImpl *this,DataSourceInstanceID ds_id,DataSourceConfig *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  TaskRunner *pTVar3;
  undefined8 *local_388;
  undefined8 uStack_380;
  code *local_378;
  code *pcStack_370;
  element_type *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  DataSourceInstanceID local_358;
  DataSourceConfig local_350;
  
  local_368 = (element_type *)CONCAT62(local_368._2_6_,(short)config->target_buffer_);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>
            (&(this->allowed_target_buffers_)._M_t,(unsigned_short *)&local_368);
  local_368 = (this->weak_ptr_factory_).weak_ptr_.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pTVar3 = this->task_runner_;
    p_Stack_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Stack_360 = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      pTVar3 = this->task_runner_;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_002ba1f1;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      pTVar3 = this->task_runner_;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_002ba1f1:
  local_358 = ds_id;
  protos::gen::DataSourceConfig::DataSourceConfig(&local_350,config);
  local_378 = (code *)0x0;
  pcStack_370 = (code *)0x0;
  local_388 = (undefined8 *)0x0;
  uStack_380 = 0;
  puVar2 = (undefined8 *)operator_new(0x338);
  p_Var1 = p_Stack_360;
  p_Stack_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *puVar2 = local_368;
  puVar2[1] = p_Var1;
  local_368 = (element_type *)0x0;
  puVar2[2] = local_358;
  protos::gen::DataSourceConfig::DataSourceConfig((DataSourceConfig *)(puVar2 + 3),&local_350);
  pcStack_370 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
                ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
              ::_M_manager;
  local_388 = puVar2;
  (*pTVar3->_vptr_TaskRunner[2])(pTVar3);
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,3);
  }
  protos::gen::DataSourceConfig::~DataSourceConfig(&local_350);
  if (p_Stack_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_360);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::SetupDataSource(
    DataSourceInstanceID ds_id,
    const DataSourceConfig& config) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  allowed_target_buffers_.insert(static_cast<BufferID>(config.target_buffer()));
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, ds_id, config] {
    if (weak_this)
      weak_this->producer_->SetupDataSource(ds_id, std::move(config));
  });
}